

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_> *
testing::internal::
ActionResultHolder<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>::
PerformAction<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>(unsigned_int)>
          (Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
           *action,ArgumentTuple *args)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  *pAVar4;
  _Head_base<0UL,_unsigned_int,_false> local_5c;
  _Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_58;
  _Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_38;
  
  pAVar4 = (ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
            *)operator_new(0x20);
  local_5c._M_head_impl =
       (args->super__Tuple_impl<0UL,_unsigned_int>).super__Head_base<0UL,_unsigned_int,_false>.
       _M_head_impl;
  Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::Perform((Result *)&local_58,action,(ArgumentTuple *)&local_5c);
  pCVar3 = local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
  pCVar2 = local_58._M_impl.super__Vector_impl_data._M_finish;
  pCVar1 = local_58._M_impl.super__Vector_impl_data._M_start;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pAVar4->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_002ecec0;
  (pAVar4->result_).value_.
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_start = pCVar1;
  (pAVar4->result_).value_.
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_finish = pCVar2;
  (pAVar4->result_).value_.
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pCVar3;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            (&local_38);
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            (&local_58);
  return pAVar4;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }